

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.cpp
# Opt level: O2

void __thiscall smf::MidiEvent::MidiEvent(MidiEvent *this,MidiEvent *mfevent)

{
  pointer puVar1;
  int iVar2;
  int i;
  long lVar3;
  
  MidiMessage::MidiMessage(&this->super_MidiMessage);
  iVar2 = mfevent->track;
  this->tick = mfevent->tick;
  this->track = iVar2;
  this->seconds = mfevent->seconds;
  this->seq = mfevent->seq;
  this->m_eventlink = (MidiEvent *)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
             (long)(mfevent->super_MidiMessage).
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(mfevent->super_MidiMessage).
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  for (lVar3 = 0;
      puVar1 = (this->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>
               .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
      lVar3 < *(int *)&(this->super_MidiMessage).
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (int)puVar1; lVar3 = lVar3 + 1) {
    puVar1[lVar3] =
         (mfevent->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[lVar3];
  }
  return;
}

Assistant:

MidiEvent::MidiEvent(const MidiEvent& mfevent) : MidiMessage() {
	track   = mfevent.track;
	tick    = mfevent.tick;
	seconds = mfevent.seconds;
	seq     = mfevent.seq;
	m_eventlink = NULL;

	this->resize(mfevent.size());
	for (int i=0; i<(int)this->size(); i++) {
		(*this)[i] = mfevent[i];
	}
}